

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

DataType deqp::gles31::Functional::anon_unknown_0::randomType(Random *rnd)

{
  int iVar1;
  int numRows_00;
  DataType scalarType_00;
  DataType scalarType;
  int size;
  int numRows;
  int numCols;
  Random *rnd_local;
  
  iVar1 = de::Random::getInt(rnd,0,7);
  if (iVar1 == 0) {
    iVar1 = de::Random::getInt(rnd,2,4);
    numRows_00 = de::Random::getInt(rnd,2,4);
    rnd_local._4_4_ = glu::getDataTypeMatrix(iVar1,numRows_00);
  }
  else {
    iVar1 = de::Random::getInt(rnd,1,4);
    scalarType_00 =
         de::Random::chooseWeighted<glu::DataType,glu::DataType_const*,float_const*>
                   (rnd,randomType::s_types,(DataType *)randomType::s_weights,randomType::s_weights)
    ;
    rnd_local._4_4_ = glu::getDataTypeVector(scalarType_00,iVar1);
  }
  return rnd_local._4_4_;
}

Assistant:

DataType randomType (Random& rnd)
{
	using namespace glu;

	if (rnd.getInt(0, 7) == 0)
	{
		const int numCols = rnd.getInt(2, 4), numRows = rnd.getInt(2, 4);

		return getDataTypeMatrix(numCols, numRows);
	}
	else
	{
		static const DataType	s_types[]	= { TYPE_FLOAT,	TYPE_INT,	TYPE_UINT	};
		static const float		s_weights[] = { 3.0,		1.0,		1.0			};
		const int				size		= rnd.getInt(1, 4);
		const DataType			scalarType	= rnd.chooseWeighted<DataType>(
			DE_ARRAY_BEGIN(s_types), DE_ARRAY_END(s_types), DE_ARRAY_BEGIN(s_weights));
		return getDataTypeVector(scalarType, size);
	}

	DE_FATAL("Impossible");
	return TYPE_INVALID;
}